

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resldexe.cpp
# Opt level: O2

osfildef * __thiscall CResLoader::open_lib_res(CResLoader *this,char *libfile,char *respath)

{
  FILE *__stream;
  CVmImageLoaderMres_resload res_ifc;
  CVmImageLoaderMres_resload local_50;
  
  __stream = fopen(libfile,"rb");
  if (__stream == (FILE *)0x0) {
    __stream = (FILE *)0x0;
  }
  else {
    local_50.super_CVmImageLoaderMres._vptr_CVmImageLoaderMres =
         (_func_int **)&PTR__CVmImageLoaderMres_resload_00347060;
    local_50.respath_ = respath;
    local_50.respath_len_ = strlen(respath);
    local_50.found_ = 0;
    local_50.link_ = (char *)0x0;
    CVmImageLoader::load_resources_from_fp
              ((osfildef *)__stream,libfile,&local_50.super_CVmImageLoaderMres);
    if (local_50.found_ == 0) {
      fclose(__stream);
      __stream = (FILE *)0x0;
    }
    else if (local_50.link_ == (char *)0x0) {
      fseek(__stream,(ulong)local_50.res_seek_,0);
    }
    else {
      fclose(__stream);
      __stream = fopen(local_50.link_,"rb");
    }
    CVmImageLoaderMres_resload::~CVmImageLoaderMres_resload(&local_50);
  }
  return (osfildef *)__stream;
}

Assistant:

osfildef *CResLoader::open_lib_res(const char *libfile,
                                   const char *respath)
{
    osfildef *fp;

    /* try opening the file */
    fp = osfoprb(libfile, OSFTT3IMG);
    
    /* if we couldn't open the file, we can't load the resource */
    if (fp == 0)
        return 0;

    /* set up a resource finder for our resource */
    CVmImageLoaderMres_resload res_ifc(respath);
    
    /* load the file, so that we can try finding the resource */
    CVmImageLoader::load_resources_from_fp(fp, libfile, &res_ifc);
    
    /* check to see if we found it */
    if (res_ifc.found_resource())
    {
        /* we got it - check the type */
        if (res_ifc.get_link_fname() != 0)
        {
            /* 
             *   linked local file - close the library file and open the
             *   local file instead 
             */
            osfcls(fp);
            fp = osfoprb(res_ifc.get_link_fname(), OSFOPRB);
        }
        else
        {
            /* embedded resource - seek to the first byte */
            osfseek(fp, res_ifc.get_resource_seek(), OSFSK_SET);
        }

        /* return the library file handle */
        return fp;
    }
    else
    {
        /* didn't find the resource - close the library */
        osfcls(fp);

        /* tell the caller we didn't find the resource */
        return 0;
    }
}